

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_3::
ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::DefaultConverter>
::ConvertOne(ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::DefaultConverter>
             *this,UnboundConversion *conv,string_view conv_string)

{
  FormatConversionSpecImpl FVar1;
  bool bVar2;
  BoundConversion bound;
  BoundConversion local_20;
  
  local_20.super_FormatConversionSpecImpl.conv_ = v|s;
  local_20.super_FormatConversionSpecImpl.length_mod_ = none;
  bVar2 = ArgContext::Bind(&this->arg_context_,conv,&local_20);
  if (bVar2) {
    FVar1.flags_ = local_20.super_FormatConversionSpecImpl.flags_;
    FVar1.conv_ = local_20.super_FormatConversionSpecImpl.conv_;
    FVar1.length_mod_ = local_20.super_FormatConversionSpecImpl.length_mod_;
    FVar1._3_1_ = local_20.super_FormatConversionSpecImpl._3_1_;
    FVar1.width_ = local_20.super_FormatConversionSpecImpl.width_;
    FVar1.precision_ = local_20.super_FormatConversionSpecImpl.precision_;
    bVar2 = (*(code *)*(Data *)((long)local_20.arg_ + 8))
                      ((local_20.arg_)->data_,FVar1,(this->converter_).sink_);
    return bVar2;
  }
  return false;
}

Assistant:

bool ConvertOne(const UnboundConversion& conv, string_view conv_string) {
    BoundConversion bound;
    if (!arg_context_.Bind(&conv, &bound)) return false;
    return converter_.ConvertOne(bound, conv_string);
  }